

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall ObjectTest_basic_set_set_Test::TestBody(ObjectTest_basic_set_set_Test *this)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  object obj;
  AssertHelper local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  undefined1 local_e8 [8];
  _Rb_tree_node_base _Stack_e0;
  size_t local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  size_t local_90;
  _Rb_tree<bool,_bool,_std::_Identity<bool>,_std::less<bool>,_std::allocator<bool>_> local_88;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_58;
  char local_28;
  
  local_58._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_28 = '\0';
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Rb_tree_const_iterator<bool>,std::_Rb_tree_const_iterator<bool>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Rb_tree_const_iterator<bool> *)local_b8,
             (_Rb_tree_const_iterator<bool> *)&local_88);
  std::_Rb_tree<bool,_bool,_std::_Identity<bool>,_std::less<bool>,_std::allocator<bool>_>::~_Rb_tree
            ((_Rb_tree<bool,_bool,_std::_Identity<bool>,_std::less<bool>,_std::allocator<bool>_> *)
             local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<bool> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x240,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<bool,_std::less<bool>,_std::allocator<bool>_>,_std::set<bool,_std::less<bool>,_std::allocator<bool>_>,_nullptr>
            ((set<bool,_std::less<bool>,_std::allocator<bool>_> *)local_e8,
             (object *)&local_58._M_first,
             (set<bool,_std::less<bool>,_std::allocator<bool>_> *)local_b8);
  p_Var1 = &local_88._M_impl.super__Rb_tree_header;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<bool,std::less<bool>,std::allocator<bool>>,std::set<bool,std::less<bool>,std::allocator<bool>>>
            ((internal *)local_f8,"obj .get< std::set<bool> >()","std::set<bool> {}",
             (set<bool,_std::less<bool>,_std::allocator<bool>_> *)local_e8,
             (set<bool,_std::less<bool>,_std::allocator<bool>_> *)&local_88);
  std::_Rb_tree<bool,_bool,_std::_Identity<bool>,_std::less<bool>,_std::allocator<bool>_>::~_Rb_tree
            (&local_88);
  std::_Rb_tree<bool,_bool,_std::_Identity<bool>,_std::less<bool>,_std::allocator<bool>_>::~_Rb_tree
            ((_Rb_tree<bool,_bool,_std::_Identity<bool>,_std::less<bool>,_std::allocator<bool>_> *)
             local_e8);
  std::_Rb_tree<bool,_bool,_std::_Identity<bool>,_std::less<bool>,_std::allocator<bool>_>::~_Rb_tree
            ((_Rb_tree<bool,_bool,_std::_Identity<bool>,_std::less<bool>,_std::allocator<bool>_> *)
             local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x240,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Rb_tree_const_iterator<signed_char>,std::_Rb_tree_const_iterator<signed_char>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Rb_tree_const_iterator<signed_char> *)local_b8,
             (_Rb_tree_const_iterator<signed_char> *)&local_88);
  std::
  _Rb_tree<signed_char,_signed_char,_std::_Identity<signed_char>,_std::less<signed_char>,_std::allocator<signed_char>_>
  ::~_Rb_tree((_Rb_tree<signed_char,_signed_char,_std::_Identity<signed_char>,_std::less<signed_char>,_std::allocator<signed_char>_>
               *)local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<signed char> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x241,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>,_std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            ((set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)local_e8,
             (object *)&local_58._M_first,
             (set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)local_b8);
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<signed_char,std::less<signed_char>,std::allocator<signed_char>>,std::set<signed_char,std::less<signed_char>,std::allocator<signed_char>>>
            ((internal *)local_f8,"obj .get< std::set<signed char> >()","std::set<signed char> {}",
             (set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)local_e8,
             (set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)&local_88);
  std::
  _Rb_tree<signed_char,_signed_char,_std::_Identity<signed_char>,_std::less<signed_char>,_std::allocator<signed_char>_>
  ::~_Rb_tree((_Rb_tree<signed_char,_signed_char,_std::_Identity<signed_char>,_std::less<signed_char>,_std::allocator<signed_char>_>
               *)&local_88);
  std::
  _Rb_tree<signed_char,_signed_char,_std::_Identity<signed_char>,_std::less<signed_char>,_std::allocator<signed_char>_>
  ::~_Rb_tree((_Rb_tree<signed_char,_signed_char,_std::_Identity<signed_char>,_std::less<signed_char>,_std::allocator<signed_char>_>
               *)local_e8);
  std::
  _Rb_tree<signed_char,_signed_char,_std::_Identity<signed_char>,_std::less<signed_char>,_std::allocator<signed_char>_>
  ::~_Rb_tree((_Rb_tree<signed_char,_signed_char,_std::_Identity<signed_char>,_std::less<signed_char>,_std::allocator<signed_char>_>
               *)local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x241,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::_Rb_tree_const_iterator<unsigned_char>,std::_Rb_tree_const_iterator<unsigned_char>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Rb_tree_const_iterator<unsigned_char> *)local_b8,
             (_Rb_tree_const_iterator<unsigned_char> *)&local_88);
  std::
  _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~_Rb_tree((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
               *)local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<unsigned char> >()","false")
    ;
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x242,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>,_std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
             local_e8,(object *)&local_58._M_first,
             (set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
             local_b8);
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<unsigned_char,std::less<unsigned_char>,std::allocator<unsigned_char>>,std::set<unsigned_char,std::less<unsigned_char>,std::allocator<unsigned_char>>>
            ((internal *)local_f8,"obj .get< std::set<unsigned char> >()",
             "std::set<unsigned char> {}",
             (set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
             local_e8,(set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                       *)&local_88);
  std::
  _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~_Rb_tree((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
               *)&local_88);
  std::
  _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~_Rb_tree((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
               *)local_e8);
  std::
  _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~_Rb_tree((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
               *)local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x242,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Rb_tree_const_iterator<short>,std::_Rb_tree_const_iterator<short>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Rb_tree_const_iterator<short> *)local_b8,
             (_Rb_tree_const_iterator<short> *)&local_88);
  std::_Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>::
  ~_Rb_tree((_Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>
             *)local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<short> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x243,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<short,_std::less<short>,_std::allocator<short>_>,_std::set<short,_std::less<short>,_std::allocator<short>_>,_nullptr>
            ((set<short,_std::less<short>,_std::allocator<short>_> *)local_e8,
             (object *)&local_58._M_first,
             (set<short,_std::less<short>,_std::allocator<short>_> *)local_b8);
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<short,std::less<short>,std::allocator<short>>,std::set<short,std::less<short>,std::allocator<short>>>
            ((internal *)local_f8,"obj .get< std::set<short> >()","std::set<short> {}",
             (set<short,_std::less<short>,_std::allocator<short>_> *)local_e8,
             (set<short,_std::less<short>,_std::allocator<short>_> *)&local_88);
  std::_Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>::
  ~_Rb_tree((_Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>
             *)&local_88);
  std::_Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>::
  ~_Rb_tree((_Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>
             *)local_e8);
  std::_Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>::
  ~_Rb_tree((_Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>
             *)local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x243,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Rb_tree_const_iterator<int> *)local_b8,
             (_Rb_tree_const_iterator<int> *)&local_88);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<int> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x244,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_nullptr>
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_e8,(object *)&local_58._M_first
             ,(set<int,_std::less<int>,_std::allocator<int>_> *)local_b8);
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
            ((internal *)local_f8,"obj .get< std::set<int> >()","std::set<int> {}",
             (set<int,_std::less<int>,_std::allocator<int>_> *)local_e8,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_88);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_88);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_e8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x244,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Rb_tree_const_iterator<long>,std::_Rb_tree_const_iterator<long>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Rb_tree_const_iterator<long> *)local_b8,
             (_Rb_tree_const_iterator<long> *)&local_88);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<long> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x245,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>,_nullptr>
            ((set<long,_std::less<long>,_std::allocator<long>_> *)local_e8,
             (object *)&local_58._M_first,
             (set<long,_std::less<long>,_std::allocator<long>_> *)local_b8);
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<long,std::less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
            ((internal *)local_f8,"obj .get< std::set<long> >()","std::set<long> {}",
             (set<long,_std::less<long>,_std::allocator<long>_> *)local_e8,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_88);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             &local_88);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             local_e8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x245,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Rb_tree_const_iterator<long_long>,std::_Rb_tree_const_iterator<long_long>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Rb_tree_const_iterator<long_long> *)local_b8,
             (_Rb_tree_const_iterator<long_long> *)&local_88);
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree((_Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
               *)local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<long long> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x246,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>,_std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>,_nullptr>
            ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_e8,
             (object *)&local_58._M_first,
             (set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_b8);
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<long_long,std::less<long_long>,std::allocator<long_long>>,std::set<long_long,std::less<long_long>,std::allocator<long_long>>>
            ((internal *)local_f8,"obj .get< std::set<long long> >()","std::set<long long> {}",
             (set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_e8,
             (set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)&local_88);
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree((_Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
               *)&local_88);
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree((_Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
               *)local_e8);
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree((_Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
               *)local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x246,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Rb_tree_const_iterator<long>,std::_Rb_tree_const_iterator<long>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Rb_tree_const_iterator<long> *)local_b8,
             (_Rb_tree_const_iterator<long> *)&local_88);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<intmax_t> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x247,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>,_nullptr>
            ((set<long,_std::less<long>,_std::allocator<long>_> *)local_e8,
             (object *)&local_58._M_first,
             (set<long,_std::less<long>,_std::allocator<long>_> *)local_b8);
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<long,std::less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
            ((internal *)local_f8,"obj .get< std::set<intmax_t> >()","std::set<intmax_t> {}",
             (set<long,_std::less<long>,_std::allocator<long>_> *)local_e8,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_88);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             &local_88);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             local_e8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x247,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Rb_tree_const_iterator<float>,std::_Rb_tree_const_iterator<float>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Rb_tree_const_iterator<float> *)local_b8,
             (_Rb_tree_const_iterator<float> *)&local_88);
  std::_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
  ~_Rb_tree((_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
             *)local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<float> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x248,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<float,_std::less<float>,_std::allocator<float>_>,_std::set<float,_std::less<float>,_std::allocator<float>_>,_nullptr>
            ((set<float,_std::less<float>,_std::allocator<float>_> *)local_e8,
             (object *)&local_58._M_first,
             (set<float,_std::less<float>,_std::allocator<float>_> *)local_b8);
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<float,std::less<float>,std::allocator<float>>,std::set<float,std::less<float>,std::allocator<float>>>
            ((internal *)local_f8,"obj .get< std::set<float> >()","std::set<float> {}",
             (set<float,_std::less<float>,_std::allocator<float>_> *)local_e8,
             (set<float,_std::less<float>,_std::allocator<float>_> *)&local_88);
  std::_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
  ~_Rb_tree((_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
             *)&local_88);
  std::_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
  ~_Rb_tree((_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
             *)local_e8);
  std::_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
  ~_Rb_tree((_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
             *)local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x248,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Rb_tree_const_iterator<double>,std::_Rb_tree_const_iterator<double>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Rb_tree_const_iterator<double> *)local_b8,
             (_Rb_tree_const_iterator<double> *)&local_88);
  std::_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  ::~_Rb_tree((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
               *)local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<double> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x249,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<double,_std::less<double>,_std::allocator<double>_>,_std::set<double,_std::less<double>,_std::allocator<double>_>,_nullptr>
            ((set<double,_std::less<double>,_std::allocator<double>_> *)local_e8,
             (object *)&local_58._M_first,
             (set<double,_std::less<double>,_std::allocator<double>_> *)local_b8);
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<double,std::less<double>,std::allocator<double>>,std::set<double,std::less<double>,std::allocator<double>>>
            ((internal *)local_f8,"obj .get< std::set<double> >()","std::set<double> {}",
             (set<double,_std::less<double>,_std::allocator<double>_> *)local_e8,
             (set<double,_std::less<double>,_std::allocator<double>_> *)&local_88);
  std::_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  ::~_Rb_tree((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
               *)&local_88);
  std::_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  ::~_Rb_tree((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
               *)local_e8);
  std::_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  ::~_Rb_tree((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
               *)local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x249,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Rb_tree_const_iterator<long_double>,std::_Rb_tree_const_iterator<long_double>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Rb_tree_const_iterator<long_double> *)local_b8,
             (_Rb_tree_const_iterator<long_double> *)&local_88);
  std::
  _Rb_tree<long_double,_long_double,_std::_Identity<long_double>,_std::less<long_double>,_std::allocator<long_double>_>
  ::~_Rb_tree((_Rb_tree<long_double,_long_double,_std::_Identity<long_double>,_std::less<long_double>,_std::allocator<long_double>_>
               *)local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<long double> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x24a,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>,_std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>,_nullptr>
            ((set<long_double,_std::less<long_double>,_std::allocator<long_double>_> *)local_e8,
             (object *)&local_58._M_first,
             (set<long_double,_std::less<long_double>,_std::allocator<long_double>_> *)local_b8);
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<long_double,std::less<long_double>,std::allocator<long_double>>,std::set<long_double,std::less<long_double>,std::allocator<long_double>>>
            ((internal *)local_f8,"obj .get< std::set<long double> >()","std::set<long double> {}",
             (set<long_double,_std::less<long_double>,_std::allocator<long_double>_> *)local_e8,
             (set<long_double,_std::less<long_double>,_std::allocator<long_double>_> *)&local_88);
  std::
  _Rb_tree<long_double,_long_double,_std::_Identity<long_double>,_std::less<long_double>,_std::allocator<long_double>_>
  ::~_Rb_tree((_Rb_tree<long_double,_long_double,_std::_Identity<long_double>,_std::less<long_double>,_std::allocator<long_double>_>
               *)&local_88);
  std::
  _Rb_tree<long_double,_long_double,_std::_Identity<long_double>,_std::less<long_double>,_std::allocator<long_double>_>
  ::~_Rb_tree((_Rb_tree<long_double,_long_double,_std::_Identity<long_double>,_std::less<long_double>,_std::allocator<long_double>_>
               *)local_e8);
  std::
  _Rb_tree<long_double,_long_double,_std::_Identity<long_double>,_std::less<long_double>,_std::allocator<long_double>_>
  ::~_Rb_tree((_Rb_tree<long_double,_long_double,_std::_Identity<long_double>,_std::less<long_double>,_std::allocator<long_double>_>
               *)local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x24a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::_Rb_tree_const_iterator<std::__cxx11::u8string>,std::_Rb_tree_const_iterator<std::__cxx11::u8string>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
              *)local_b8,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
              *)&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::_Identity<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::_Identity<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
               *)local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<std::u8string> >()","false")
    ;
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x24b,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_e8,(object *)&local_58._M_first,
             (set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_b8);
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<std::__cxx11::u8string,std::less<std::__cxx11::u8string>,std::allocator<std::__cxx11::u8string>>,std::set<std::__cxx11::u8string,std::less<std::__cxx11::u8string>,std::allocator<std::__cxx11::u8string>>>
            ((internal *)local_f8,"obj .get< std::set<std::u8string> >()",
             "std::set<std::u8string> {}",
             (set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_e8,
             (set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::_Identity<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::_Identity<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
               *)&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::_Identity<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::_Identity<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
               *)local_e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::_Identity<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::_Identity<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
               *)local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x24b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  _Stack_e0._M_parent = (_Base_ptr)0x0;
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._0_8_ =
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x0;
  local_c0 = 0;
  _Stack_e0._M_left = &_Stack_e0;
  _Stack_e0._M_right = &_Stack_e0;
  local_b8 = (undefined1  [8])&_Stack_e0;
  local_88._M_impl._0_8_ = &_Stack_e0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::_Rb_tree_const_iterator<jessilib::object>,std::_Rb_tree_const_iterator<jessilib::object>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Rb_tree_const_iterator<jessilib::object> *)local_b8,
             (_Rb_tree_const_iterator<jessilib::object> *)&local_88);
  std::
  _Rb_tree<jessilib::object,_jessilib::object,_std::_Identity<jessilib::object>,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
  ::~_Rb_tree((_Rb_tree<jessilib::object,_jessilib::object,_std::_Identity<jessilib::object>,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
               *)local_e8);
  local_b8[0] = local_28 == '\x06';
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::set<object> >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x24c,(char *)local_e8);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if (local_e8 != (undefined1  [8])&_Stack_e0._M_parent) {
      operator_delete((void *)local_e8,(ulong)((long)&(_Stack_e0._M_parent)->_M_color + 1));
    }
    if ((_Rb_tree_node_base *)local_88._M_impl._0_8_ != (_Rb_tree_node_base *)0x0) {
      (**(code **)(*(long *)local_88._M_impl._0_8_ + 8))();
    }
    if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_b0,pbStack_b0);
    }
  }
  local_a8 = (_Base_ptr)0x0;
  local_b8 = (undefined1  [8])0x0;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = 0;
  local_a0 = (_Base_ptr)&pbStack_b0;
  local_98 = (_Base_ptr)&pbStack_b0;
  jessilib::object::
  get<std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>,_std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>,_nullptr>
            ((set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
              *)local_e8,(object *)&local_58._M_first,
             (set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
              *)local_b8);
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  testing::internal::
  CmpHelperEQ<std::set<jessilib::object,std::less<jessilib::object>,std::allocator<jessilib::object>>,std::set<jessilib::object,std::less<jessilib::object>,std::allocator<jessilib::object>>>
            ((internal *)local_f8,"obj .get< std::set<object> >()","std::set<object> {}",
             (set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
              *)local_e8,
             (set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
              *)&local_88);
  std::
  _Rb_tree<jessilib::object,_jessilib::object,_std::_Identity<jessilib::object>,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
  ::~_Rb_tree((_Rb_tree<jessilib::object,_jessilib::object,_std::_Identity<jessilib::object>,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
               *)&local_88);
  std::
  _Rb_tree<jessilib::object,_jessilib::object,_std::_Identity<jessilib::object>,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
  ::~_Rb_tree((_Rb_tree<jessilib::object,_jessilib::object,_std::_Identity<jessilib::object>,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
               *)local_e8);
  std::
  _Rb_tree<jessilib::object,_jessilib::object,_std::_Identity<jessilib::object>,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
  ::~_Rb_tree((_Rb_tree<jessilib::object,_jessilib::object,_std::_Identity<jessilib::object>,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
               *)local_b8);
  if (local_f8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x24c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_58._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_set_set) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, std::set<bool>);
	OBJECT_BASIC_SET_TEST(obj, std::set<signed char>);
	OBJECT_BASIC_SET_TEST(obj, std::set<unsigned char>);
	OBJECT_BASIC_SET_TEST(obj, std::set<short>);
	OBJECT_BASIC_SET_TEST(obj, std::set<int>);
	OBJECT_BASIC_SET_TEST(obj, std::set<long>);
	OBJECT_BASIC_SET_TEST(obj, std::set<long long>);
	OBJECT_BASIC_SET_TEST(obj, std::set<intmax_t>);
	OBJECT_BASIC_SET_TEST(obj, std::set<float>);
	OBJECT_BASIC_SET_TEST(obj, std::set<double>);
	OBJECT_BASIC_SET_TEST(obj, std::set<long double>);
	OBJECT_BASIC_SET_TEST(obj, std::set<std::u8string>);
	OBJECT_BASIC_SET_TEST(obj, std::set<object>);
}